

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode override_login(Curl_easy *data,connectdata *conn,char **userp,char **passwdp,
                       char **optionsp)

{
  undefined1 *puVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  CURLUcode CVar6;
  undefined8 in_RAX;
  undefined8 uVar7;
  char *pcVar8;
  CURLcode CVar9;
  bool bVar10;
  bool bVar11;
  _Bool netrc_passwd_changed;
  _Bool netrc_user_changed;
  undefined8 local_38;
  
  local_38._4_4_ = (uint)((ulong)in_RAX >> 0x20);
  if (((data->set).use_netrc == CURL_NETRC_REQUIRED) && (((conn->bits).field_0x4 & 0x80) != 0)) {
    if (*userp == (char *)0x0) {
      local_38 = (ulong)local_38._4_4_ << 0x20;
    }
    else {
      uVar7 = (*Curl_cfree)(*userp);
      *userp = (char *)0x0;
      local_38 = CONCAT44(local_38._4_4_,(int)CONCAT71((int7)((ulong)uVar7 >> 8),1));
    }
    bVar10 = *passwdp != (char *)0x0;
    if (bVar10) {
      (*Curl_cfree)(*passwdp);
      *passwdp = (char *)0x0;
    }
    puVar1 = &(conn->bits).field_0x4;
    *puVar1 = *puVar1 & 0x7f;
  }
  else {
    local_38 = (ulong)local_38._4_4_ << 0x20;
    bVar10 = false;
  }
  if ((data->set).str[0x2c] != (char *)0x0) {
    (*Curl_cfree)(*userp);
    pcVar8 = (*Curl_cstrdup)((data->set).str[0x2c]);
    *userp = pcVar8;
    if (pcVar8 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    puVar1 = &(conn->bits).field_0x4;
    *puVar1 = *puVar1 | 0x80;
    local_38 = CONCAT44(local_38._4_4_,(int)CONCAT71((int7)((ulong)pcVar8 >> 8),1));
  }
  if ((data->set).str[0x2d] != (char *)0x0) {
    (*Curl_cfree)(*passwdp);
    pcVar8 = (*Curl_cstrdup)((data->set).str[0x2d]);
    *passwdp = pcVar8;
    if (pcVar8 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    puVar1 = &(conn->bits).field_0x4;
    *puVar1 = *puVar1 | 0x80;
    bVar10 = true;
  }
  if ((data->set).str[0x2e] != (char *)0x0) {
    (*Curl_cfree)(*optionsp);
    pcVar8 = (*Curl_cstrdup)((data->set).str[0x2e]);
    *optionsp = pcVar8;
    if (pcVar8 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  puVar1 = &(conn->bits).field_0x6;
  *puVar1 = *puVar1 & 0xef;
  if (((data->set).use_netrc != CURL_NETRC_IGNORED) &&
     ((((*userp == (char *)0x0 || (**userp == '\0')) || (*passwdp == (char *)0x0)) ||
      (**passwdp == '\0')))) {
    local_38 = local_38 & 0xffffffffffff;
    iVar5 = Curl_parsenetrc((conn->host).name,userp,passwdp,(_Bool *)((long)&local_38 + 7),
                            (_Bool *)((long)&local_38 + 6),(data->set).str[0x14]);
    uVar3 = local_38;
    if (iVar5 < 1) {
      if (-1 < iVar5) {
        puVar1 = &(conn->bits).field_0x4;
        *(uint *)puVar1 = *(uint *)puVar1 | 0x100080;
        uVar2 = (uint)local_38 & 0xff;
        if (local_38._7_1_ != '\0') {
          uVar2 = 1;
        }
        local_38 = CONCAT44(local_38._4_4_,uVar2);
        uVar4 = local_38;
        local_38._6_1_ = SUB81(uVar3,6);
        bVar11 = local_38._6_1_ != '\0';
        local_38 = uVar4;
        if (bVar11) {
          bVar10 = true;
        }
        goto LAB_0011cc26;
      }
      bVar11 = false;
    }
    else {
      Curl_infof(data,"Couldn\'t find host %s in the .netrc file; using defaults\n",
                 (conn->host).name);
LAB_0011cc26:
      bVar11 = true;
    }
    if (!bVar11) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  if ((char)local_38 == '\0') {
switchD_0011cc67_caseD_0:
    CVar9 = CURLE_OK;
    if (bVar10) {
      CVar9 = CURLE_URL_MALFORMAT;
      CVar6 = curl_url_set((data->state).uh,CURLUPART_PASSWORD,*passwdp,0);
      if (CVar6 < CURLUE_UNKNOWN_PART) {
        CVar9 = *(CURLcode *)(&DAT_001511b4 + (ulong)CVar6 * 4);
      }
    }
  }
  else {
    CVar6 = curl_url_set((data->state).uh,CURLUPART_USER,*userp,0);
    CVar9 = CURLE_URL_MALFORMAT;
    switch(CVar6) {
    case CURLUE_OK:
      goto switchD_0011cc67_caseD_0;
    case CURLUE_UNSUPPORTED_SCHEME:
      CVar9 = CURLE_UNSUPPORTED_PROTOCOL;
      break;
    case CURLUE_OUT_OF_MEMORY:
      return CURLE_OUT_OF_MEMORY;
    case CURLUE_USER_NOT_ALLOWED:
      CVar9 = CURLE_LOGIN_DENIED;
    }
  }
  return CVar9;
}

Assistant:

static CURLcode override_login(struct Curl_easy *data,
                               struct connectdata *conn,
                               char **userp, char **passwdp, char **optionsp)
{
  bool user_changed = FALSE;
  bool passwd_changed = FALSE;
  CURLUcode uc;

  if(data->set.use_netrc == CURL_NETRC_REQUIRED && conn->bits.user_passwd) {
    /* ignore user+password in the URL */
    if(*userp) {
      Curl_safefree(*userp);
      user_changed = TRUE;
    }
    if(*passwdp) {
      Curl_safefree(*passwdp);
      passwd_changed = TRUE;
    }
    conn->bits.user_passwd = FALSE; /* disable user+password */
  }

  if(data->set.str[STRING_USERNAME]) {
    free(*userp);
    *userp = strdup(data->set.str[STRING_USERNAME]);
    if(!*userp)
      return CURLE_OUT_OF_MEMORY;
    conn->bits.user_passwd = TRUE; /* enable user+password */
    user_changed = TRUE;
  }

  if(data->set.str[STRING_PASSWORD]) {
    free(*passwdp);
    *passwdp = strdup(data->set.str[STRING_PASSWORD]);
    if(!*passwdp)
      return CURLE_OUT_OF_MEMORY;
    conn->bits.user_passwd = TRUE; /* enable user+password */
    passwd_changed = TRUE;
  }

  if(data->set.str[STRING_OPTIONS]) {
    free(*optionsp);
    *optionsp = strdup(data->set.str[STRING_OPTIONS]);
    if(!*optionsp)
      return CURLE_OUT_OF_MEMORY;
  }

  conn->bits.netrc = FALSE;
  if(data->set.use_netrc != CURL_NETRC_IGNORED &&
      (!*userp || !**userp || !*passwdp || !**passwdp)) {
    bool netrc_user_changed = FALSE;
    bool netrc_passwd_changed = FALSE;
    int ret;

    ret = Curl_parsenetrc(conn->host.name,
                          userp, passwdp,
                          &netrc_user_changed, &netrc_passwd_changed,
                          data->set.str[STRING_NETRC_FILE]);
    if(ret > 0) {
      infof(data, "Couldn't find host %s in the "
            DOT_CHAR "netrc file; using defaults\n",
            conn->host.name);
    }
    else if(ret < 0) {
      return CURLE_OUT_OF_MEMORY;
    }
    else {
      /* set bits.netrc TRUE to remember that we got the name from a .netrc
         file, so that it is safe to use even if we followed a Location: to a
         different host or similar. */
      conn->bits.netrc = TRUE;
      conn->bits.user_passwd = TRUE; /* enable user+password */

      if(netrc_user_changed) {
        user_changed = TRUE;
      }
      if(netrc_passwd_changed) {
        passwd_changed = TRUE;
      }
    }
  }

  /* for updated strings, we update them in the URL */
  if(user_changed) {
    uc = curl_url_set(data->state.uh, CURLUPART_USER, *userp, 0);
    if(uc)
      return Curl_uc_to_curlcode(uc);
  }
  if(passwd_changed) {
    uc = curl_url_set(data->state.uh, CURLUPART_PASSWORD, *passwdp, 0);
    if(uc)
      return Curl_uc_to_curlcode(uc);
  }
  return CURLE_OK;
}